

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uuid.cpp
# Opt level: O1

void __thiscall CompareUUID_Lt_Test::TestBody(CompareUUID_Lt_Test *this)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  pointer *__ptr;
  char *in_R9;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  AssertHelper local_48;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string local_30;
  
  uVar2 = *(ulong *)(this->super_CompareUUID).t1_.data_._M_elems;
  uVar1 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
          (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
          (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  uVar2 = *(ulong *)(this->super_CompareUUID).t3_.data_._M_elems;
  uVar2 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
          (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
          (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  if (uVar1 == uVar2) {
    uVar2 = *(ulong *)((this->super_CompareUUID).t1_.data_._M_elems + 8);
    uVar4 = *(ulong *)((this->super_CompareUUID).t3_.data_._M_elems + 8);
    uVar1 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
            (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
            (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    uVar2 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
            (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
            (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
    uVar4 = 0;
    if (uVar1 != uVar2) goto LAB_001c59b0;
  }
  else {
LAB_001c59b0:
    uVar4 = (ulong)(-(uint)(uVar1 < uVar2) | 1);
  }
  local_40[0] = SUB81(uVar4 >> 0x1f,0);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (-1 < (int)uVar4) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,(AssertionResult *)"t1_ < t3_","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,0xe7,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  uVar2 = *(ulong *)(this->super_CompareUUID).t1_.data_._M_elems;
  uVar1 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
          (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
          (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  uVar2 = *(ulong *)(this->super_CompareUUID).t2_.data_._M_elems;
  uVar2 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
          (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
          (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  if (uVar1 == uVar2) {
    uVar2 = *(ulong *)((this->super_CompareUUID).t1_.data_._M_elems + 8);
    uVar4 = *(ulong *)((this->super_CompareUUID).t2_.data_._M_elems + 8);
    uVar1 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
            (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
            (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    uVar2 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
            (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
            (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
    uVar3 = 0;
    if (uVar1 == uVar2) goto LAB_001c5aac;
  }
  uVar3 = -(uint)(uVar1 < uVar2) | 1;
LAB_001c5aac:
  local_40[0] = (internal)(-1 < (int)uVar3);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_40[0]) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,(AssertionResult *)"t1_ < t2_","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,0xe8,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  return;
}

Assistant:

TEST_F (CompareUUID, Lt) {
    EXPECT_TRUE (t1_ < t3_);
    EXPECT_FALSE (t1_ < t2_);
}